

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

int er_hint_cmp_fn(State *a,State *b,hash_fns_t *fns)

{
  uint uVar1;
  Hint *pHVar2;
  Hint *pHVar3;
  Rule *pRVar4;
  Rule *pRVar5;
  int iVar6;
  ulong uVar7;
  
  uVar1 = (a->error_recovery_hints).n;
  if (uVar1 == (b->error_recovery_hints).n) {
    uVar7 = 0;
    while( true ) {
      if (uVar1 == uVar7) {
        return 0;
      }
      pHVar2 = (a->error_recovery_hints).v[uVar7];
      pHVar3 = (b->error_recovery_hints).v[uVar7];
      if (pHVar2->depth != pHVar3->depth) break;
      pRVar4 = pHVar2->rule;
      pRVar5 = pHVar3->rule;
      iVar6 = strcmp((((pRVar4->elems).v[(pRVar4->elems).n - 1]->e).term)->string,
                     (((pRVar5->elems).v[(pRVar5->elems).n - 1]->e).term)->string);
      if (iVar6 != 0) {
        return 1;
      }
      uVar7 = uVar7 + 1;
      if (pRVar4->prod->index != pRVar5->prod->index) {
        return 1;
      }
    }
  }
  return 1;
}

Assistant:

static int er_hint_cmp_fn(State *a, State *b, hash_fns_t *fns) {
  uint i;
  VecHint *sa = &a->error_recovery_hints, *sb = &b->error_recovery_hints;
  Term *ta, *tb;
  (void)fns;
  if (sa->n != sb->n) return 1;
  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    tb = sb->v[i]->rule->elems.v[sb->v[i]->rule->elems.n - 1]->e.term;
    if (sa->v[i]->depth != sb->v[i]->depth || strcmp(ta->string, tb->string) ||
        sa->v[i]->rule->prod->index != sb->v[i]->rule->prod->index)
      return 1;
  }
  return 0;
}